

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

long __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<long>
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_runtime_error<std::domain_error,_void> *this_00;
  json_runtime_error<std::runtime_error,_void> *this_01;
  string_view_type sVar1;
  string_view_type sVar2;
  type tVar3;
  error_code eVar4;
  ulong local_38;
  string local_30;
  
  do {
    switch((byte)((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                   *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)
                 ->json_const_pointer_ & 0xf) {
    case 1:
      return (ulong)*(byte *)((long)&(((pointer)this)->
                                     super_heap_string_base<unsigned_long,_std::allocator<char>_>).
                                     extra_ + 2);
    case 2:
    case 3:
      return *(long *)&(((pointer)this)->
                       super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8;
    default:
      this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Not an integer",(allocator<char> *)&local_38);
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_30);
      __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    case 5:
      return (long)*(double *)
                    &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)
                     .field_0x8;
    case 6:
      return (ulong)*(ushort *)
                     ((long)&(((pointer)this)->
                             super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ +
                     2);
    case 7:
    case 0xf:
      sVar1 = as_string_view(this);
      sVar2 = as_string_view(this);
      tVar3 = detail::to_integer<long,wchar_t>(sVar1._M_str,sVar2._M_len,(long *)&local_38);
      if (tVar3.ec == success) {
        return local_38;
      }
      this_01 = (json_runtime_error<std::runtime_error,_void> *)__cxa_allocate_exception(0x18);
      eVar4 = detail::make_error_code(tVar3.ec);
      (**(code **)(*(long *)eVar4._M_cat + 0x20))(&local_30,eVar4._M_cat,eVar4._M_value);
      json_runtime_error<std::runtime_error,_void>::json_runtime_error(this_01,&local_30);
      __cxa_throw(this_01,&json_runtime_error<std::runtime_error,void>::typeinfo,
                  json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
    case 8:
    case 9:
      this = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             (((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
             byte_str_).ptr_;
    }
  } while( true );
}

Assistant:

IntegerType as_integer() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    IntegerType val;
                    auto result = jsoncons::detail::to_integer(as_string_view().data(), as_string_view().length(), val);
                    if (!result)
                    {
                        JSONCONS_THROW(json_runtime_error<std::runtime_error>(result.error_code().message()));
                    }
                    return val;
                }
                case json_storage_kind::half_float:
                    return static_cast<IntegerType>(cast<half_storage>().value());
                case json_storage_kind::float64:
                    return static_cast<IntegerType>(cast<double_storage>().value());
                case json_storage_kind::int64:
                    return static_cast<IntegerType>(cast<int64_storage>().value());
                case json_storage_kind::uint64:
                    return static_cast<IntegerType>(cast<uint64_storage>().value());
                case json_storage_kind::boolean:
                    return static_cast<IntegerType>(cast<bool_storage>().value() ? 1 : 0);
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().template as_integer<IntegerType>();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().template as_integer<IntegerType>();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not an integer"));
            }
        }